

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O0

SyntaxPrinter * __thiscall slang::syntax::SyntaxPrinter::print(SyntaxPrinter *this,SyntaxNode *node)

{
  bool bVar1;
  SyntaxNode *node_00;
  SyntaxNode *pSVar2;
  SyntaxPrinter *in_RSI;
  SyntaxPrinter *in_RDI;
  Token TVar3;
  Token token;
  SyntaxNode *childNode;
  size_t i;
  size_t childCount;
  SyntaxPrinter *in_stack_00000150;
  undefined1 in_stack_00000158 [16];
  SyntaxNode *in_stack_ffffffffffffffb8;
  SyntaxNode *this_00;
  SyntaxNode *in_stack_ffffffffffffffc0;
  Token local_38;
  SyntaxNode *pSStack_30;
  SyntaxNode *local_20;
  
  node_00 = (SyntaxNode *)SyntaxNode::getChildCount(in_stack_ffffffffffffffb8);
  for (local_20 = (SyntaxNode *)0x0; local_20 < node_00;
      local_20 = (SyntaxNode *)((long)&local_20->kind + 1)) {
    pSVar2 = SyntaxNode::childNode(this_00,(size_t)in_stack_ffffffffffffffc0);
    if (pSVar2 == (SyntaxNode *)0x0) {
      TVar3 = SyntaxNode::childToken(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
      bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x574f80);
      local_38 = TVar3;
      if (bVar1) {
        this_00 = TVar3._0_8_;
        pSStack_30 = (SyntaxNode *)TVar3.info;
        print(in_stack_00000150,(Token)in_stack_00000158);
        in_stack_ffffffffffffffb8 = this_00;
        in_stack_ffffffffffffffc0 = pSStack_30;
      }
    }
    else {
      print(in_RSI,node_00);
    }
  }
  return in_RDI;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::print(const SyntaxNode& node) {
    size_t childCount = node.getChildCount();
    for (size_t i = 0; i < childCount; i++) {
        if (auto childNode = node.childNode(i); childNode)
            print(*childNode);
        else if (auto token = node.childToken(i); token)
            print(token);
    }
    return *this;
}